

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

shared_ptr<Quest_Context> __thiscall Character::GetQuest(Character *this,short id)

{
  bool bVar1;
  pointer ppVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined6 in_register_00000032;
  shared_ptr<Quest_Context> sVar4;
  _Self local_30;
  _Self local_28;
  iterator it;
  short id_local;
  Character *this_local;
  
  local_28._M_node =
       (_Base_ptr)
       std::
       map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
       ::find((map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
               *)(CONCAT62(in_register_00000032,id) + 0x390),(key_type *)((long)&it._M_node + 6));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
       ::end((map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
              *)(CONCAT62(in_register_00000032,id) + 0x390));
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    std::shared_ptr<Quest_Context>::shared_ptr((shared_ptr<Quest_Context> *)this);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>::
             operator->(&local_28);
    std::shared_ptr<Quest_Context>::shared_ptr((shared_ptr<Quest_Context> *)this,&ppVar2->second);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Quest_Context>)
         sVar4.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Quest_Context> Character::GetQuest(short id)
{
	auto it = this->quests.find(id);

	if (it == this->quests.end())
		return std::shared_ptr<Quest_Context>();

	return it->second;
}